

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O2

CborError cbor_encode_simple_value(CborEncoder *encoder,uint8_t value)

{
  CborError CVar1;
  
  if ((byte)(value - 0x19) < 7) {
    return CborErrorIllegalSimpleType;
  }
  CVar1 = encode_number(encoder,(ulong)value,0xe0);
  return CVar1;
}

Assistant:

CborError cbor_encode_simple_value(CborEncoder *encoder, uint8_t value)
{
#ifndef CBOR_ENCODER_NO_CHECK_USER
    /* check if this is a valid simple type */
    if (value >= HalfPrecisionFloat && value <= Break)
        return CborErrorIllegalSimpleType;
#endif
    return encode_number(encoder, value, SimpleTypesType << MajorTypeShift);
}